

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# float_conversion.cc
# Opt level: O0

void __thiscall
absl::lts_20250127::str_format_internal::anon_unknown_0::StackArray::RunWithCapacity
          (StackArray *this,size_t capacity,Func f)

{
  Func f_00;
  Func f_01;
  Func f_02;
  Func f_03;
  Func f_04;
  VoidPtr VVar1;
  size_t step;
  size_t capacity_local;
  Func f_local;
  
  VVar1 = f.ptr_;
  if ((StackArray *)0x280 < this) {
    __assert_fail("capacity <= kMaxCapacity",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/_deps/absl-src/absl/strings/internal/str_format/float_conversion.cc"
                  ,0x4a,
                  "static void absl::str_format_internal::(anonymous namespace)::StackArray::RunWithCapacity(size_t, Func)"
                 );
  }
  if (5 < (ulong)(this + 0x7f) >> 7) {
    __assert_fail("step <= kNumSteps",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/_deps/absl-src/absl/strings/internal/str_format/float_conversion.cc"
                  ,0x4c,
                  "static void absl::str_format_internal::(anonymous namespace)::StackArray::RunWithCapacity(size_t, Func)"
                 );
  }
  switch((ulong)(this + 0x7f) >> 7) {
  case 1:
    f_04.invoker_ = (Invoker<void,_absl::lts_20250127::Span<unsigned_int>_>)VVar1.obj;
    f_04.ptr_ = (VoidPtr)capacity;
    (anonymous_namespace)::StackArray::RunWithCapacityImpl<1ul>(f_04);
    break;
  case 2:
    f_03.invoker_ = (Invoker<void,_absl::lts_20250127::Span<unsigned_int>_>)VVar1.obj;
    f_03.ptr_ = (VoidPtr)capacity;
    (anonymous_namespace)::StackArray::RunWithCapacityImpl<2ul>(f_03);
    break;
  case 3:
    f_02.invoker_ = (Invoker<void,_absl::lts_20250127::Span<unsigned_int>_>)VVar1.obj;
    f_02.ptr_ = (VoidPtr)capacity;
    (anonymous_namespace)::StackArray::RunWithCapacityImpl<3ul>(f_02);
    break;
  case 4:
    f_01.invoker_ = (Invoker<void,_absl::lts_20250127::Span<unsigned_int>_>)VVar1.obj;
    f_01.ptr_ = (VoidPtr)capacity;
    (anonymous_namespace)::StackArray::RunWithCapacityImpl<4ul>(f_01);
    break;
  case 5:
    f_00.invoker_ = (Invoker<void,_absl::lts_20250127::Span<unsigned_int>_>)VVar1.obj;
    f_00.ptr_ = (VoidPtr)capacity;
    (anonymous_namespace)::StackArray::RunWithCapacityImpl<5ul>(f_00);
    break;
  default:
    __assert_fail("false && \"Invalid capacity\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/_deps/absl-src/absl/strings/internal/str_format/float_conversion.cc"
                  ,0x5a,
                  "static void absl::str_format_internal::(anonymous namespace)::StackArray::RunWithCapacity(size_t, Func)"
                 );
  }
  return;
}

Assistant:

static void RunWithCapacity(size_t capacity, Func f) {
    assert(capacity <= kMaxCapacity);
    const size_t step = (capacity + kStep - 1) / kStep;
    assert(step <= kNumSteps);
    switch (step) {
      case 1:
        return RunWithCapacityImpl<1>(f);
      case 2:
        return RunWithCapacityImpl<2>(f);
      case 3:
        return RunWithCapacityImpl<3>(f);
      case 4:
        return RunWithCapacityImpl<4>(f);
      case 5:
        return RunWithCapacityImpl<5>(f);
    }

    assert(false && "Invalid capacity");
  }